

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConsumer.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
Vault::HttpConsumer::del
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Client *client,Url *url)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  optional<Vault::HttpResponse> response;
  long *local_108 [2];
  long local_f8 [2];
  long *local_e8 [2];
  long local_d8 [2];
  _Optional_payload_base<Vault::HttpResponse> local_c8;
  _Optional_payload_base<Vault::HttpResponse> local_78;
  
  iVar2 = (*client->_vptr_Client[2])(client);
  if ((char)iVar2 == '\0') {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  else {
    iVar2 = (*client->_vptr_Client[10])(client);
    (*client->_vptr_Client[8])(local_e8,client);
    (*client->_vptr_Client[9])(local_108,client);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
              (&local_c8,(long *)CONCAT44(extraout_var,iVar2),url,local_e8,local_108);
    if (local_108[0] != local_f8) {
      operator_delete(local_108[0],local_f8[0] + 1);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    local_78._M_engaged = false;
    if (local_c8._M_engaged == true) {
      std::_Optional_payload_base<Vault::HttpResponse>::_M_construct<Vault::HttpResponse_const&>
                (&local_78,(HttpResponse *)&local_c8);
    }
    bVar1 = HttpClient::is_success((optional<Vault::HttpResponse> *)&local_78);
    if (local_78._M_engaged == true) {
      std::_Optional_payload_base<Vault::HttpResponse>::_M_destroy(&local_78);
    }
    if (bVar1) {
      if (local_c8._M_engaged == false) {
LAB_0018ffa9:
        std::__throw_bad_optional_access();
      }
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_payload._M_value._M_dataplus._M_p =
           (pointer)((long)&(__return_storage_ptr__->
                            super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                            )._M_payload.
                            super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                            .
                            super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ._M_payload + 0x10);
      bVar1 = true;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,
                 local_c8._M_payload._M_value.body.value_._M_dataplus._M_p,
                 (pointer)(local_c8._M_payload._M_value.body.value_._M_string_length +
                          (long)local_c8._M_payload._M_value.body.value_._M_dataplus._M_p));
    }
    else {
      if (local_c8._M_engaged != false) {
        iVar2 = (*client->_vptr_Client[10])(client);
        if (local_c8._M_engaged == false) goto LAB_0018ffa9;
        HttpClient::handleResponseError
                  ((HttpClient *)CONCAT44(extraout_var_00,iVar2),(HttpResponse *)&local_c8);
      }
      bVar1 = false;
    }
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = bVar1;
    if (local_c8._M_engaged == true) {
      std::_Optional_payload_base<Vault::HttpResponse>::_M_destroy(&local_c8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> Vault::HttpConsumer::del(const Vault::Client &client,
                                                    const Vault::Url &url) {
  if (!client.is_authenticated()) {
    return std::nullopt;
  }

  auto response =
      client.getHttpClient().del(url, client.getToken(), client.getNamespace());

  if (HttpClient::is_success(response)) {
    return {response.value().body.value()};
  }

  if (response) {
    client.getHttpClient().handleResponseError(response.value());
  }

  return std::nullopt;
}